

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

bool __thiscall libchars::history::search(history *this,size_t idx)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  ulong local_48;
  iterator local_30;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  size_t local_20;
  size_t idx_local;
  history *this_local;
  
  local_20 = idx;
  idx_local = (size_t)this;
  bVar2 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(this + 0x30));
  if (bVar2) {
    this[8] = (history)0x0;
    this_local._7_1_ = false;
  }
  else {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(this + 0x30));
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_28,&local_30);
    sVar1 = local_20;
    *(_List_node_base **)(this + 0x48) = local_28._M_node;
    this[0x50] = (history)0x1;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 < sVar1) {
      local_48 = std::__cxx11::string::length();
    }
    else {
      local_48 = local_20;
    }
    *(ulong *)(this + 0x58) = local_48;
    this[8] = (history)0x1;
    bVar2 = search_prev(this);
    if ((bVar2) && (((byte)this[0x50] & 1) == 0)) {
      this_local._7_1_ = true;
    }
    else {
      this[8] = (history)0x0;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool history::search(size_t idx)
    {
        if (lines.empty()) {
            busy = false;
            return false;
        }
        else {
            li = lines.end();
            overflow = true;
            s_idx = (idx > line_tmp.length()) ? line_tmp.length() : idx;
            busy = true;
            if (!search_prev() || overflow) {
                busy = false;
                return false;
            }
            return true;
        }
    }